

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::count(QLatin1StringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QLatin1StringMatcher matcher;
  QLatin1StringMatcher QStack_258;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&QStack_258,0xaa,0x220);
  QLatin1StringMatcher::QLatin1StringMatcher(&QStack_258,needle,cs);
  lVar2 = -1;
  lVar1 = -1;
  do {
    lVar1 = QLatin1StringMatcher::indexIn(&QStack_258,haystack,lVar1 + 1);
    lVar2 = lVar2 + 1;
  } while (lVar1 != -1);
  QLatin1StringMatcher::~QLatin1StringMatcher(&QStack_258);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QLatin1StringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    qsizetype num = 0;
    qsizetype i = -1;

    QLatin1StringMatcher matcher(needle, cs);
    while ((i = matcher.indexIn(haystack, i + 1)) != -1)
        ++num;

    return num;
}